

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O1

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> * __thiscall
Descriptor::detect(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
                  Descriptor *this,Mat *image)

{
  undefined4 local_68 [2];
  Mat *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  void *local_40 [2];
  long local_30;
  
  cv::HOGDescriptor::getDefaultPeopleDetector();
  local_58 = 0;
  local_68[0] = 0x81030005;
  local_60 = (Mat *)local_40;
  cv::HOGDescriptor::setSVMDetector((_InputArray *)&this->descriptor);
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = 0;
  local_68[0] = 0x1010000;
  local_50 = 0x800000008;
  local_48 = 0;
  local_60 = image;
  cv::HOGDescriptor::detectMultiScale
            (0,0x3ff0cccccccccccd,0x4000000000000000,&this->descriptor,local_68,
             __return_storage_ptr__,&local_50,&local_48,0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Rect> Descriptor::detect(cv::Mat image) {
  // use trained svm from opencv
  descriptor.setSVMDetector(cv::HOGDescriptor::getDefaultPeopleDetector());
  std::vector<cv::Rect> detected;
  descriptor.detectMultiScale(image, detected, 0, cv::Size(8, 8), cv::Size(),
                              1.05, 2, false);  // using appropriate parameters
  return detected;
}